

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O3

int __thiscall MeCab::POSIDGenerator::id(POSIDGenerator *this,char *feature)

{
  char *pcVar1;
  char cVar2;
  _Alloc_hider _Var3;
  long lVar4;
  bool bVar5;
  int iVar6;
  char *__dest;
  char **input;
  size_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  size_t size;
  char *pcVar14;
  char **ppcVar15;
  char *pcVar16;
  string tmp;
  string local_58;
  POSIDGenerator *local_38;
  
  __dest = (char *)operator_new__(0x2000);
  input = (char **)operator_new__(0x10000);
  sVar7 = strlen(feature);
  if (0x1ffe < sVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"std::strlen(feature) < buf.size() - 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"too long feature",0x10);
    die::~die((die *)&local_58);
  }
  local_38 = this;
  strncpy(__dest,feature,0x1fff);
  sVar7 = strlen(__dest);
  if ((long)sVar7 < 1) {
    size = 0;
  }
  else {
    pcVar14 = __dest + sVar7;
    pcVar16 = __dest;
    ppcVar15 = input;
    lVar4 = 0;
    uVar10 = 0x2000;
    do {
      for (; (lVar13 = lVar4, cVar2 = *pcVar16, cVar2 == '\t' || (cVar2 == ' '));
          pcVar16 = pcVar16 + 1) {
        lVar4 = lVar13;
      }
      if (cVar2 == '\"') {
        pcVar16 = pcVar16 + 1;
        pcVar11 = pcVar16;
        for (pcVar9 = pcVar16;
            (pcVar12 = pcVar9, pcVar9 < pcVar14 &&
            ((cVar2 = *pcVar9, cVar2 != '\"' ||
             (pcVar12 = pcVar9 + 1, pcVar1 = pcVar9 + 1, pcVar9 = pcVar12, *pcVar1 == '\"'))));
            pcVar9 = pcVar9 + 1) {
          *pcVar11 = cVar2;
          pcVar11 = pcVar11 + 1;
        }
        local_58._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar9 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar12,pcVar14,&local_58);
      }
      else {
        local_58._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar9 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar16,pcVar14,&local_58);
        pcVar11 = pcVar9;
      }
      if (uVar10 < 2) {
        *ppcVar15 = pcVar16;
        if (uVar10 - 1 == 0) break;
      }
      else {
        *pcVar11 = '\0';
        *ppcVar15 = pcVar16;
      }
      ppcVar15 = ppcVar15 + 1;
      pcVar16 = pcVar9 + 1;
      lVar4 = lVar13 + 1;
      uVar10 = uVar10 - 1;
    } while (pcVar16 < pcVar14);
    size = lVar13 + 1;
    if (0x1fff < size) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                 ,0x79);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xeb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"n < col.size()",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"too long CSV entities",0x15);
      die::~die((die *)&local_58);
    }
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar5 = RewriteRules::rewrite(&local_38->rewrite_,size,input,&local_58);
  _Var3._M_p = local_58._M_dataplus._M_p;
  iVar6 = -1;
  if (bVar5) {
    iVar6 = atoi(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_58.field_2) {
    operator_delete(_Var3._M_p);
  }
  operator_delete__(input);
  operator_delete__(__dest);
  return iVar6;
}

Assistant:

int POSIDGenerator::id(const char *feature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(std::strlen(feature) < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature, buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  std::string tmp;
  if (!rewrite_.rewrite(n, const_cast<const char **>(col.get()), &tmp)) {
    return -1;
  }
  return std::atoi(tmp.c_str());
}